

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O3

iterator __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Find(MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  long lVar1;
  long lVar2;
  _List_iterator<GF2::MM<135UL>_> _Var3;
  long lVar4;
  
  _Var3 = std::
          __lower_bound<std::_List_iterator<GF2::MM<135ul>>,GF2::MM<135ul>,__gnu_cxx::__ops::_Iter_comp_val<GF2::MOLex<135ul>>>
                    ((this->super_list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>).
                     super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>._M_impl.
                     _M_node.super__List_node_base._M_next,this,mRight);
  if (_Var3._M_node != (_List_node_base *)this) {
    lVar4 = 0x10;
    do {
      lVar1 = *(long *)((long)&_Var3._M_node[1]._M_next + lVar4);
      lVar2 = *(long *)((long)(mRight->super_WW<135UL>)._words + lVar4);
      if (lVar4 == 0) break;
      lVar4 = lVar4 + -8;
    } while (lVar1 == lVar2);
    if (lVar1 != lVar2) {
      _Var3._M_node = (_List_node_base *)this;
    }
  }
  return (iterator)_Var3._M_node;
}

Assistant:

iterator Find(const MM<_n>& mRight)
	{	 
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет совпадения?
		if (iter != end() && *iter != mRight)
			iter = end();
		return iter;
	}